

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<unsigned_long>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<unsigned_long>_> *opt)

{
  initializer_list<unsigned_long> __l;
  bool bVar1;
  undefined8 opt_00;
  allocator_type *__a;
  typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *ptVar2;
  any in_RSI;
  typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *value;
  typed_option<unsigned_long> *in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  typed_value_base this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_type in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe0;
  
  opt_00 = boost::program_options::value<std::vector<unsigned_long,std::allocator<unsigned_long>>>()
  ;
  std::
  __shared_ptr_access<VW::config::typed_option<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16f74c);
  bVar1 = typed_option<unsigned_long>::default_value_supplied
                    ((typed_option<unsigned_long> *)0x16f754);
  if (bVar1) {
    std::
    __shared_ptr_access<VW::config::typed_option<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<VW::config::typed_option<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16f770);
    __a = (allocator_type *)typed_option<unsigned_long>::default_value(in_stack_ffffffffffffff90);
    this_00._vptr_typed_value_base = (_func_int **)&stack0xffffffffffffffb8;
    pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16f79f);
    __l._M_len = in_stack_ffffffffffffffd0;
    __l._M_array = (iterator)pvVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               this_00._vptr_typed_value_base,__l,__a);
    boost::program_options::
    typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char>::default_value
              ((typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *)
               this_00._vptr_typed_value_base,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffa0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x16f7de);
  }
  ptVar2 = add_notifier<unsigned_long>
                     ((options_boost_po *)in_RSI.content,
                      (shared_ptr<VW::config::typed_option<unsigned_long>_> *)opt_00,
                      (typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char>
                       *)in_stack_ffffffffffffffe0);
  ptVar2 = boost::program_options::
           typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char>::composing
                     (ptVar2);
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}